

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost89.c
# Opt level: O1

void cryptopro_key_meshing(gost_ctx *ctx,uchar *iv)

{
  long lVar1;
  uchar newiv [8];
  uchar newkey [32];
  undefined8 local_50;
  byte local_48 [40];
  
  lVar1 = 0;
  do {
    gostdecrypt(ctx,"i" + lVar1,local_48 + lVar1);
    lVar1 = lVar1 + 8;
  } while ((int)lVar1 != 0x20);
  RAND_priv_bytes(ctx->mask,0x20);
  gost_key_impl(ctx,local_48);
  OPENSSL_cleanse(local_48,0x20);
  if (iv != (uchar *)0x0) {
    gostcrypt(ctx,iv,(byte *)&local_50);
    *(undefined8 *)iv = local_50;
    OPENSSL_cleanse(&local_50,8);
  }
  return;
}

Assistant:

void cryptopro_key_meshing(gost_ctx * ctx, unsigned char *iv)
{
    unsigned char newkey[32];
    /* Set static keymeshing key */
    /* "Decrypt" key with keymeshing key */
    gost_dec(ctx, CryptoProKeyMeshingKey, newkey, 4);
    /* set new key */
    gost_key(ctx, newkey);
    OPENSSL_cleanse(newkey, sizeof(newkey));
    /* Encrypt iv with new key */
    if (iv != NULL ) {
        unsigned char newiv[8];
        gostcrypt(ctx, iv, newiv);
        memcpy(iv, newiv, 8);
        OPENSSL_cleanse(newiv, sizeof(newiv));
    }
}